

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O1

int __thiscall cppcms::widgets::numeric<int>::value(numeric<int> *this)

{
  char cVar1;
  runtime_error *this_00;
  string local_40;
  
  cVar1 = cppcms::widgets::base_widget::set();
  if (cVar1 != '\0') {
    return this->value_;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Value not loaded","");
  booster::runtime_error::runtime_error(this_00,&local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00112b68;
  (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00112b90;
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

T value()
			{
				if(!set())
					throw cppcms_error("Value not loaded");
				return value_;
			}